

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O1

void add_suite_selist(CuSuite *suite)

{
  CuTest *pCVar1;
  
  pCVar1 = CuTestNew("test_foreach",test_foreach);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_find",test_find);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_find_cb",test_find_cb);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_mapreduce",test_mapreduce);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_advance",test_advance);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_replace",test_replace);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_push",test_push);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_push_returns_end",test_push_returns_end);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_insert",test_insert);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_empty_list",test_empty_list);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_insert_delete_gives_null",test_insert_delete_gives_null);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_insert_many",test_insert_many);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_delete_rand",test_delete_rand);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_delete_edgecases",test_delete_edgecases);
  CuSuiteAdd(suite,pCVar1);
  pCVar1 = CuTestNew("test_push_doesnt_invalidate_iterator",test_push_doesnt_invalidate_iterator);
  CuSuiteAdd(suite,pCVar1);
  return;
}

Assistant:

void add_suite_selist(CuSuite *suite)
{
    SUITE_ADD_TEST(suite, test_foreach);
    SUITE_ADD_TEST(suite, test_find);
    SUITE_ADD_TEST(suite, test_find_cb);
    SUITE_ADD_TEST(suite, test_mapreduce);
    SUITE_ADD_TEST(suite, test_advance);
    SUITE_ADD_TEST(suite, test_replace);
    SUITE_ADD_TEST(suite, test_push);
    SUITE_ADD_TEST(suite, test_push_returns_end);
    SUITE_ADD_TEST(suite, test_insert);
    SUITE_ADD_TEST(suite, test_empty_list);
    SUITE_ADD_TEST(suite, test_insert_delete_gives_null);
    SUITE_ADD_TEST(suite, test_insert_many);
    SUITE_ADD_TEST(suite, test_delete_rand);
    SUITE_ADD_TEST(suite, test_delete_edgecases);
    SUITE_ADD_TEST(suite, test_push_doesnt_invalidate_iterator);
}